

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void HighsHashTree<int,int>::mergeIntoLeaf<1,3>
               (InnerLeaf<1> *leaf,InnerLeaf<3> *mergeLeaf,int hashPos)

{
  reference this;
  long in_RSI;
  array<HighsHashTableEntry<int,_int>,_38UL> *in_RDI;
  Entry *in_stack_00000028;
  int i;
  size_type in_stack_ffffffffffffffb8;
  array<HighsHashTableEntry<int,_int>,_38UL> *this_00;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < *(int *)(in_RSI + 8); local_18 = local_18 + 1) {
    this_00 = in_RDI;
    this = std::array<HighsHashTableEntry<int,_int>,_38UL>::operator[]
                     (in_RDI,in_stack_ffffffffffffffb8);
    HighsHashTableEntry<int,_int>::key(this);
    HighsHashTree<int,_int>::compute_hash((int *)0x56dccc);
    std::array<HighsHashTableEntry<int,_int>,_38UL>::operator[](this_00,in_stack_ffffffffffffffb8);
    HighsHashTree<int,_int>::InnerLeaf<1>::insert_entry
              (leaf,(uint64_t)mergeLeaf,hashPos,in_stack_00000028);
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }